

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_string::append
          (xpath_string *this,xpath_string *o,xpath_allocator *alloc)

{
  char *pcVar1;
  size_t __n;
  size_t __n_00;
  char_t *__dest;
  char *ptr;
  byte bVar2;
  bool bVar3;
  
  if (*o->_buffer != '\0') {
    pcVar1 = this->_buffer;
    bVar3 = *pcVar1 == '\0';
    if (bVar3 && (this->_uses_heap & 1U) == 0) {
      if (o->_uses_heap == false) {
        this->_buffer = o->_buffer;
        return;
      }
      bVar2 = 0;
    }
    else {
      bVar2 = bVar3 | this->_uses_heap;
    }
    __n = length(this);
    __n_00 = length(o);
    ptr = (char *)0x0;
    if ((bVar2 & 1) != 0) {
      ptr = pcVar1;
    }
    __dest = (char_t *)xpath_allocator::reallocate(alloc,ptr,__n + 1,__n_00 + __n + 1);
    if (__dest != (char_t *)0x0) {
      if (this->_uses_heap == false) {
        memcpy(__dest,this->_buffer,__n);
      }
      memcpy(__dest + __n,o->_buffer,__n_00);
      __dest[__n_00 + __n] = '\0';
      this->_buffer = __dest;
      this->_uses_heap = true;
      this->_length_heap = __n_00 + __n;
    }
  }
  return;
}

Assistant:

void append(const xpath_string& o, xpath_allocator* alloc)
		{
			// skip empty sources
			if (!*o._buffer) return;

			// fast append for constant empty target and constant source
			if (!*_buffer && !_uses_heap && !o._uses_heap)
			{
				_buffer = o._buffer;
			}
			else
			{
				// need to make heap copy
				size_t target_length = length();
				size_t source_length = o.length();
				size_t result_length = target_length + source_length;

				// allocate new buffer
				char_t* result = static_cast<char_t*>(alloc->reallocate(_uses_heap ? const_cast<char_t*>(_buffer) : NULL, (target_length + 1) * sizeof(char_t), (result_length + 1) * sizeof(char_t)));
				if (!result) return;

				// append first string to the new buffer in case there was no reallocation
				if (!_uses_heap) memcpy(result, _buffer, target_length * sizeof(char_t));

				// append second string to the new buffer
				memcpy(result + target_length, o._buffer, source_length * sizeof(char_t));
				result[result_length] = 0;

				// finalize
				_buffer = result;
				_uses_heap = true;
				_length_heap = result_length;
			}
		}